

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O2

error_code __thiscall
simdjson::dom::parser::ensure_capacity
          (parser *this,document *target_document,size_t desired_capacity)

{
  error_code eVar1;
  error_code eVar2;
  dom_parser_implementation *pdVar3;
  size_t max_depth;
  ulong capacity;
  
  capacity = 0x20;
  if (0x20 < desired_capacity) {
    capacity = desired_capacity;
  }
  pdVar3 = (this->implementation)._M_t.
           super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
           ._M_t.
           super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
           .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
           _M_head_impl;
  if (((pdVar3 == (dom_parser_implementation *)0x0) || (pdVar3->_capacity < capacity)) ||
     (target_document->allocated_capacity < capacity)) {
    if (this->_max_capacity < capacity) {
      eVar1 = CAPACITY;
    }
    else {
      eVar1 = SUCCESS;
      if (target_document->allocated_capacity < capacity) {
        eVar1 = document::allocate(target_document,capacity);
        pdVar3 = (this->implementation)._M_t.
                 super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                 .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
                 _M_head_impl;
      }
      if (pdVar3 == (dom_parser_implementation *)0x0) {
        max_depth = 0x400;
LAB_0016ac90:
        eVar2 = allocate(this,capacity,max_depth);
        if (eVar1 != SUCCESS) goto LAB_0016acab;
      }
      else {
        eVar2 = eVar1;
        if (pdVar3->_capacity < capacity) {
          max_depth = pdVar3->_max_depth;
          goto LAB_0016ac90;
        }
      }
      eVar1 = eVar2;
      if (eVar1 == SUCCESS) goto LAB_0016ac52;
    }
LAB_0016acab:
    this->error = eVar1;
  }
  else {
LAB_0016ac52:
    eVar1 = SUCCESS;
  }
  return eVar1;
}

Assistant:

inline error_code parser::ensure_capacity(document& target_document, size_t desired_capacity) noexcept {
  // 1. It is wasteful to allocate a document and a parser for documents spanning less than MINIMAL_DOCUMENT_CAPACITY bytes.
  // 2. If we allow desired_capacity = 0 then it is possible to exit this function with implementation == nullptr.
  if(desired_capacity < MINIMAL_DOCUMENT_CAPACITY) { desired_capacity = MINIMAL_DOCUMENT_CAPACITY; }
  // If we don't have enough capacity, (try to) automatically bump it.
  // If the document needs allocation, do it too.
  // Both in one if statement to minimize unlikely branching.
  //
  // Note: we must make sure that this function is called if capacity() == 0. We do so because we
  // ensure that desired_capacity > 0.
  if (simdjson_unlikely(capacity() < desired_capacity || target_document.capacity() < desired_capacity)) {
    if (desired_capacity > max_capacity()) {
      return error = CAPACITY;
    }
    error_code err1 = target_document.capacity() < desired_capacity ? target_document.allocate(desired_capacity) : SUCCESS;
    error_code err2 = capacity() < desired_capacity ? allocate(desired_capacity, max_depth()) : SUCCESS;
    if(err1 != SUCCESS) { return error = err1; }
    if(err2 != SUCCESS) { return error = err2; }
  }
  return SUCCESS;
}